

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_morph.cpp
# Opt level: O2

void __thiscall
AMorphedMonster::Die(AMorphedMonster *this,AActor *source,AActor *inflictor,int dmgflags)

{
  TObjPtr<AActor> *obj;
  int iVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  AActor *pAVar2;
  
  AActor::Die(&this->super_AActor,source,inflictor,dmgflags);
  obj = &this->UnmorphedMe;
  pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar2 != (AActor *)0x0) {
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (((pAVar2->flags).Value & 0x10000000) != 0) {
      iVar1 = (this->super_AActor).health;
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
      pAVar2->health = iVar1;
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
      UNRECOVERED_JUMPTABLE = (pAVar2->super_DThinker).super_DObject._vptr_DObject[0xf];
      (*UNRECOVERED_JUMPTABLE)(pAVar2,source,inflictor,(ulong)(uint)dmgflags,UNRECOVERED_JUMPTABLE);
      return;
    }
  }
  return;
}

Assistant:

void AMorphedMonster::Die (AActor *source, AActor *inflictor, int dmgflags)
{
	// Dead things don't unmorph
//	flags3 |= MF3_STAYMORPHED;
	// [MH]
	// But they can now, so that line above has been
	// moved into P_MorphedDeath() and is now set by
	// that function if and only if it is needed.
	Super::Die (source, inflictor, dmgflags);
	if (UnmorphedMe != NULL && (UnmorphedMe->flags & MF_UNMORPHED))
	{
		UnmorphedMe->health = health;
		UnmorphedMe->Die (source, inflictor, dmgflags);
	}
}